

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_hashtable_remove(arg_hashtable_t *h,void *k)

{
  uint hashvalue_00;
  uint uVar1;
  int iVar2;
  uint index;
  uint hashvalue;
  arg_hashtable_entry **pE;
  arg_hashtable_entry *e;
  void *k_local;
  arg_hashtable_t *h_local;
  
  hashvalue_00 = enhanced_hash(h,k);
  uVar1 = index_for(h->tablelength,hashvalue_00);
  _index = h->table + uVar1;
  pE = (arg_hashtable_entry **)*_index;
  while( true ) {
    if (pE == (arg_hashtable_entry **)0x0) {
      return;
    }
    if ((hashvalue_00 == *(uint *)(pE + 2)) && (iVar2 = (*h->eqfn)(k,*pE), iVar2 != 0)) break;
    _index = pE + 3;
    pE = (arg_hashtable_entry **)pE[3];
  }
  *_index = pE[3];
  h->entrycount = h->entrycount - 1;
  argtable3_xfree(*pE);
  argtable3_xfree(pE[1]);
  argtable3_xfree(pE);
  return;
}

Assistant:

void arg_hashtable_remove(arg_hashtable_t* h, const void* k) {
    /*
     * TODO: consider compacting the table when the load factor drops enough,
     *       or provide a 'compact' method.
     */

    struct arg_hashtable_entry* e;
    struct arg_hashtable_entry** pE;
    unsigned int hashvalue;
    unsigned int index;

    hashvalue = enhanced_hash(h, k);
    index = index_for(h->tablelength, hashvalue);
    pE = &(h->table[index]);
    e = *pE;
    while (NULL != e) {
        /* Check hash value to short circuit heavier comparison */
        if ((hashvalue == e->h) && (h->eqfn(k, e->k))) {
            *pE = e->next;
            h->entrycount--;
            xfree(e->k);
            xfree(e->v);
            xfree(e);
            return;
        }
        pE = &(e->next);
        e = e->next;
    }
}